

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int open_serialport(char *dev,int baudrate)

{
  speed_t __speed;
  undefined1 local_54 [4];
  speed_t baud;
  termios options;
  int fd;
  int baudrate_local;
  char *dev_local;
  
  options.c_ospeed = baudrate;
  options.c_ispeed = open(dev,0x102);
  if (options.c_ispeed != 0xffffffff) {
    __speed = tcio_baud(options.c_ospeed);
    if ((loglevel & 8U) != 0) {
      syslog(7,"serial opened\n");
    }
    tcgetattr(options.c_ispeed,(termios *)local_54);
    cfsetispeed((termios *)local_54,__speed);
    cfsetospeed((termios *)local_54,__speed);
    cfmakeraw((termios *)local_54);
    options.c_lflag._2_1_ = 1;
    options.c_lflag._3_1_ = 0;
    tcsetattr(options.c_ispeed,0,(termios *)local_54);
  }
  return options.c_ispeed;
}

Assistant:

int open_serialport(const char *dev, int baudrate)
{
    int fd;

    fd = open(dev, O_RDWR | O_NOCTTY /*| O_NDELAY*/);
    if (fd != -1) {
        struct termios options;
        speed_t baud = tcio_baud(baudrate);
        LOGD("serial opened\n" );
        // The old way. Let's not change baud settings
        // fcntl(fd, F_SETFL, 0);

        // get the parameters
        tcgetattr(fd, &options);

        cfsetispeed(&options, baud);
        cfsetospeed(&options, baud);

        cfmakeraw(&options);

        //options.c_cflag |= (IXON | IXOFF);
        options.c_cc[VTIME] = 1;
        options.c_cc[VMIN]  = 0;

        // Set the new options for the port...
        tcsetattr(fd, TCSANOW, &options);
    }
    return fd;
}